

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP4Serializer.cpp
# Opt level: O3

void __thiscall adios2::format::BP4Serializer::BP4Serializer(BP4Serializer *this,Comm *comm)

{
  BPBase::BPBase((BPBase *)&(this->super_BP4Base).field_0x190,comm);
  BP4Base::BP4Base(&this->super_BP4Base,&PTR_construction_vtable_24__00872df8,comm);
  BPSerializer::BPSerializer
            ((BPSerializer *)&(this->super_BP4Base).field_0xa0,&PTR_construction_vtable_24__00872e08
             ,comm,'\x04');
  (this->super_BP4Base)._vptr_BP4Base = (_func_int **)0x872c78;
  *(undefined8 *)&(this->super_BP4Base).field_0x190 = 0x872dd8;
  *(undefined8 *)&(this->super_BP4Base).field_0xa0 = 0x872d28;
  *(undefined8 *)&(this->super_BP4Base).field_0xb8 = 0;
  *(undefined8 *)&(this->super_BP4Base).field_0xc0 = 0;
  *(undefined8 *)&(this->super_BP4Base).field_0xc8 = 0;
  *(undefined8 *)&(this->super_BP4Base).field_0xd0 = 0;
  *(undefined8 *)&(this->super_BP4Base).field_0xd8 = 0;
  *(undefined8 *)&(this->super_BP4Base).field_0xe0 = 0;
  *(undefined1 **)&(this->super_BP4Base).field_0xe8 = &(this->super_BP4Base).field_0x118;
  *(undefined8 *)&(this->super_BP4Base).field_0xf0 = 1;
  *(undefined8 *)&(this->super_BP4Base).field_0xf8 = 0;
  *(undefined8 *)&(this->super_BP4Base).field_0x100 = 0;
  *(undefined4 *)&(this->super_BP4Base).field_0x108 = 0x3f800000;
  *(undefined8 *)&(this->super_BP4Base).field_0x110 = 0;
  *(undefined8 *)&(this->super_BP4Base).field_0x118 = 0;
  *(undefined1 **)&(this->super_BP4Base).field_0x120 = &(this->super_BP4Base).field_0x150;
  *(undefined8 *)&(this->super_BP4Base).field_0x128 = 1;
  *(undefined8 *)&(this->super_BP4Base).field_0x130 = 0;
  *(undefined8 *)&(this->super_BP4Base).field_0x138 = 0;
  *(undefined4 *)&(this->super_BP4Base).field_0x140 = 0x3f800000;
  *(undefined8 *)&(this->super_BP4Base).field_0x148 = 0;
  *(undefined8 *)&(this->super_BP4Base).field_0x150 = 0;
  *(undefined1 **)&(this->super_BP4Base).field_0x158 = &(this->super_BP4Base).field_0x188;
  *(undefined8 *)&(this->super_BP4Base).field_0x160 = 1;
  *(undefined8 *)&(this->super_BP4Base).field_0x168 = 0;
  *(undefined8 *)&(this->super_BP4Base).field_0x170 = 0;
  *(undefined4 *)&(this->super_BP4Base).field_0x178 = 0x3f800000;
  *(undefined8 *)&(this->super_BP4Base).field_0x180 = 0;
  *(undefined8 *)&(this->super_BP4Base).field_0x188 = 0;
  return;
}

Assistant:

BP4Serializer::BP4Serializer(helper::Comm const &comm)
: BPBase(comm), BP4Base(comm), BPSerializer(comm, 4)
{
}